

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILS.h
# Opt level: O3

double __thiscall
imrt::ILS::notTargetedSearch(ILS *this,Plan *current_plan,int max_time,int max_iterations)

{
  long lVar1;
  double dVar2;
  clock_t cVar3;
  Plan *this_00;
  ostream *poVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  double dVar10;
  double dVar11;
  double local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  double local_50;
  double local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"## Staring ILS search.",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  cVar3 = clock();
  this->time_begin = cVar3;
  this_00 = (Plan *)operator_new(0xd0);
  Plan::Plan(this_00,current_plan);
  local_80 = Plan::getEvaluation(current_plan);
  dVar2 = (double)max_time;
  local_50 = 0.0;
  bVar5 = true;
  iVar6 = 1;
  local_48 = 0.0;
  local_78 = SUB84(local_80,0);
  uStack_74 = (undefined4)((ulong)local_80 >> 0x20);
  while( true ) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Iteration: ",0xb);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", eval: ",8);
    poVar4 = (ostream *)
             std::ostream::operator<<((ostream *)poVar4,EvaluationFunction::n_evaluations);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", time: ",8);
    fVar8 = roundf((float)(local_48 * 1000.0));
    poVar4 = std::ostream::_M_insert<double>((double)(fVar8 / 1000.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", best: ",8);
    poVar4 = std::ostream::_M_insert<double>(local_80);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", current: ",0xb);
    poVar4 = std::ostream::_M_insert<double>((double)CONCAT44(uStack_74,local_78));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (!bVar5) {
      (*this->_vptr_ILS[8])(this,current_plan);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Iteration: ",0xb);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", per: ",7);
      poVar4 = std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      local_78 = extraout_XMM0_Da;
      uStack_74 = extraout_XMM0_Db;
    }
    uVar9 = SUB84(local_50,0);
    if (max_time != 0) {
      uVar9 = SUB84(dVar2 - local_48,0);
    }
    (*this->_vptr_ILS[3])(uVar9,this,current_plan,0);
    uVar7 = -(ulong)(1e-05 < (double)CONCAT44(uStack_74,local_78) -
                             (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    dVar11 = (double)(~uVar7 & CONCAT44(uStack_74,local_78) |
                     CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) & uVar7);
    if (1e-05 < local_80 - dVar11) {
      Plan::newCopy(this_00,current_plan);
      local_80 = dVar11;
    }
    cVar3 = clock();
    dVar10 = (double)(cVar3 - this->time_begin) / 1000000.0;
    if ((max_time != 0) && (dVar2 <= dVar10)) break;
    if (max_time != 0) {
      local_50 = dVar2 - dVar10;
    }
    (*this->_vptr_ILS[4])(SUB84(local_50,0),this,current_plan,0);
    dVar10 = dVar11 - (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    bVar5 = 1e-05 < dVar10;
    local_78 = extraout_XMM0_Da_01;
    uStack_74 = extraout_XMM0_Db_01;
    if (dVar10 <= 1e-05) {
      local_78 = SUB84(dVar11,0);
      uStack_74 = (undefined4)((ulong)dVar11 >> 0x20);
    }
    if (1e-05 < local_80 - (double)CONCAT44(uStack_74,local_78)) {
      Plan::newCopy(this_00,current_plan);
      local_80 = (double)CONCAT44(uStack_74,local_78);
    }
    iVar6 = iVar6 + 1;
    cVar3 = clock();
    local_48 = (double)(cVar3 - this->time_begin) / 1000000.0;
    if ((max_iterations <= iVar6 && max_iterations != 0) || (max_time != 0 && dVar2 <= local_48))
    break;
  }
  Plan::newCopy(current_plan,this_00);
  dVar2 = Plan::getEvaluation(current_plan);
  EvaluationFunction::generate_voxel_dose_functions(this_00->ev);
  cVar3 = clock();
  lVar1 = this->time_begin;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"## Total used time: ",0x14);
  poVar4 = std::ostream::_M_insert<double>((double)(cVar3 - lVar1) / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return dVar2;
}

Assistant:

double notTargetedSearch(Plan& current_plan, int max_time, int max_iterations) {

    cout << "## Staring ILS search." << endl;
    std::clock_t time_end;

    //Start time
    time_begin=clock();

    //Best plan found so far
    Plan& best_plan= *new Plan(current_plan);

    double local_eval, aux_eval,  best_eval;
    double used_time=0;
    double ls_time=0;
    // flag is used for the termination criterion
    bool flag=true;
    // improvement signals a new best solution found
    bool improvement=true;
    int no_improvement, iteration=1, perturbation_iteration=0;
    no_improvement = 0;
    
    best_eval = local_eval = current_plan.getEvaluation();
    while (flag) {
      cout << "Iteration: " << iteration << ", eval: " << 
              EvaluationFunction::n_evaluations << 
              ", time: "<< (roundf(used_time * 1000) / 1000)  << 
              ", best: " << best_eval << ", current: " << 
              local_eval << endl;
      
      // Perturbate if we haven't improved last iteration
      if (!improvement) {
        local_eval = perturbation(current_plan);
        cout << "Iteration: " << iteration << ", per: " << local_eval << endl;
      }
      
      improvement = false;

      // Track the used time
      if (max_time!=0) ls_time = max_time - used_time;
      
      // Apply intensity ls
      aux_eval = iLocalSearch (current_plan, ls_time, false);
      // Check if there if there is a new solution was found
      if ((local_eval - aux_eval) > 0.00001) {
        local_eval = aux_eval;
      }
      
      // Check if there is a better global best
      if ((best_eval - local_eval) > 0.00001) {
        best_eval = local_eval;
        best_plan.newCopy(current_plan);
      }
      
      //Check print (comment if not needed)
      /*current_plan.eval();
      cout << "returned eval: " << aux_eval << " current local: " << local_eval << " in current plan: " << current_plan.getEvaluation()<< endl;
      cout << endl;
      for(int j=0;j<5;j++)
      current_plan.printIntensity(j);
      cout << endl;*/
      
      // Check termination criterion
      time_end = clock();
      used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
      if (max_time!=0 && used_time >= max_time) {
        flag = false;
        break;
      }
      // Update used time
      if (max_time!=0) ls_time = max_time-used_time;
      
      // Apply aperture ls
      aux_eval = aLocalSearch (current_plan, ls_time , false);
      // Check if there if there is a new solution was found
      if ((local_eval - aux_eval) > 0.00001) {
        local_eval = aux_eval;
        improvement = true;
      }
      
      // Check if there is a better global best
      if ((best_eval - local_eval) > 0.00001) {
        best_eval = local_eval;
        best_plan.newCopy(current_plan);
      }

      iteration++;

      // Check termination criterion
      time_end=clock();
      used_time=double(time_end- time_begin) / CLOCKS_PER_SEC;
      if (max_time!=0 && used_time >= max_time) flag = false;
      if (max_iterations!=0 && iteration>=max_iterations) flag = false;
    }

    current_plan.newCopy(best_plan);
    aux_eval = current_plan.getEvaluation();
    best_plan.getEvaluationFunction()->generate_voxel_dose_functions();
    
    time_end = clock();
    used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
    cout << "## Total used time: " << used_time << endl;
    return(aux_eval);
  }